

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack8to4_int8.h
# Opt level: O3

void ncnn::im2col_sgemm_pack8to4_int8_sse(Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Option *opt)

{
  uint uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar5;
  int *piVar6;
  ulong uVar7;
  long lVar8;
  void *pvVar9;
  undefined1 (*pauVar10) [16];
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  undefined4 *puVar15;
  undefined8 *puVar16;
  ulong uVar17;
  long lVar18;
  int iVar19;
  undefined4 *puVar20;
  undefined8 *puVar21;
  int iVar22;
  long lVar23;
  int nn;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  char cVar40;
  char cVar41;
  int iVar31;
  char cVar42;
  char cVar43;
  char cVar45;
  char cVar46;
  int iVar44;
  int iVar47;
  int iVar48;
  undefined1 auVar32 [16];
  int iVar49;
  int iVar51;
  int iVar52;
  int iVar53;
  undefined1 auVar50 [16];
  int iVar54;
  int iVar56;
  int iVar57;
  int iVar58;
  undefined1 auVar55 [16];
  int iVar59;
  int iVar68;
  int iVar69;
  int iVar70;
  undefined1 auVar60 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar92 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 local_88 [64];
  size_t local_48;
  ulong local_38;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  
  iVar5 = cpu_support_x86_xop();
  if (iVar5 == 0) {
    uVar1 = bottom_im2col->w;
    uVar7 = (ulong)(int)uVar1;
    iVar5 = bottom_im2col->h;
    uVar14 = bottom_im2col->c;
    local_38 = (ulong)(uint)top_blob->c;
    local_48 = 0;
    local_88._16_8_ = 0;
    local_88._24_4_ = 0;
    local_88._0_8_ = (void *)0x0;
    local_88._8_4_ = 0;
    local_88._12_4_ = 0;
    local_88._48_12_ = SUB1612((undefined1  [16])0x0,4);
    local_88._32_8_ = (Allocator *)0x0;
    local_88._40_4_ = 0;
    local_88._44_4_ = 0;
    uVar13 = (uVar1 & 1) + (uVar1 >> 1);
    if ((long)uVar7 < 2) {
      uVar13 = uVar1;
    }
    Mat::create((Mat *)local_88,iVar5 << (1 < (long)uVar7),uVar14,uVar13,8,8,
                opt->workspace_allocator);
    if (0 < (int)uVar1 >> 1) {
      lVar8 = 0;
      uVar11 = 0;
      do {
        if (0 < (int)uVar14) {
          puVar15 = (undefined4 *)(local_48 * uVar11 * local_88._16_8_ + local_88._0_8_);
          uVar17 = 0;
          do {
            if (0 < iVar5) {
              puVar20 = (undefined4 *)
                        ((long)bottom_im2col->data +
                        bottom_im2col->cstep * bottom_im2col->elemsize * uVar17 + lVar8);
              iVar22 = iVar5;
              do {
                uVar2 = puVar20[1];
                uVar3 = puVar20[2];
                uVar4 = puVar20[3];
                *puVar15 = *puVar20;
                puVar15[1] = uVar2;
                puVar15[2] = uVar3;
                puVar15[3] = uVar4;
                puVar15 = puVar15 + 4;
                puVar20 = puVar20 + (ulong)uVar1 * 2;
                iVar22 = iVar22 + -1;
              } while (iVar22 != 0);
            }
            uVar17 = uVar17 + 1;
          } while (uVar17 != uVar14);
        }
        uVar11 = uVar11 + 1;
        lVar8 = lVar8 + 0x10;
      } while (uVar11 != (uint)((int)uVar1 >> 1));
    }
    uVar11 = uVar7 & 0xfffffffffffffffe;
    if ((uint)uVar11 != uVar1) {
      pvVar9 = (void *)(uVar11 * 8 + (long)bottom_im2col->data);
      do {
        if (0 < (int)uVar14) {
          uVar13 = ((uint)(uVar11 >> 0x1f) & 1) + (int)uVar11;
          puVar16 = (undefined8 *)
                    ((long)(int)(((int)uVar13 >> 1) + ((int)uVar11 - (uVar13 & 0xfffffffe))) *
                     local_48 * local_88._16_8_ + local_88._0_8_);
          uVar17 = 0;
          do {
            if (0 < iVar5) {
              puVar21 = (undefined8 *)
                        (bottom_im2col->cstep * bottom_im2col->elemsize * uVar17 + (long)pvVar9);
              iVar22 = iVar5;
              do {
                *puVar16 = *puVar21;
                puVar16 = puVar16 + 1;
                puVar21 = puVar21 + uVar7;
                iVar22 = iVar22 + -1;
              } while (iVar22 != 0);
            }
            uVar17 = uVar17 + 1;
          } while (uVar17 != uVar14);
        }
        uVar11 = uVar11 + 1;
        pvVar9 = (void *)((long)pvVar9 + 8);
      } while ((long)uVar11 < (long)uVar7);
    }
    if (0 < (int)local_38) {
      iVar5 = iVar5 * uVar14;
      uVar11 = 0;
      do {
        piVar6 = (int *)(top_blob->cstep * uVar11 * top_blob->elemsize + (long)top_blob->data);
        if ((int)uVar1 < 2) {
          uVar17 = 0;
        }
        else {
          lVar8 = 0;
          uVar12 = 0;
          do {
            if (iVar5 < 1) {
              iVar31 = 0;
              iVar44 = 0;
              iVar47 = 0;
              iVar48 = 0;
              auVar101 = (undefined1  [16])0x0;
              iVar49 = 0;
              iVar51 = 0;
              iVar52 = 0;
              iVar53 = 0;
              iVar27 = 0;
              iVar28 = 0;
              iVar29 = 0;
              iVar30 = 0;
              iVar54 = 0;
              iVar56 = 0;
              iVar57 = 0;
              iVar58 = 0;
              auVar82 = (undefined1  [16])0x0;
              iVar59 = 0;
              iVar68 = 0;
              iVar69 = 0;
              iVar70 = 0;
              iVar22 = 0;
              iVar24 = 0;
              iVar25 = 0;
              iVar26 = 0;
            }
            else {
              lVar18 = kernel->cstep * uVar11 * kernel->elemsize;
              iVar22 = 0;
              iVar24 = 0;
              iVar25 = 0;
              iVar26 = 0;
              lVar23 = 0;
              iVar59 = 0;
              iVar68 = 0;
              iVar69 = 0;
              iVar70 = 0;
              iVar54 = 0;
              iVar56 = 0;
              iVar57 = 0;
              iVar58 = 0;
              iVar27 = 0;
              iVar28 = 0;
              iVar29 = 0;
              iVar30 = 0;
              iVar49 = 0;
              iVar51 = 0;
              iVar52 = 0;
              iVar53 = 0;
              iVar31 = 0;
              iVar44 = 0;
              iVar47 = 0;
              iVar48 = 0;
              auVar73 = (undefined1  [16])0x0;
              auVar100 = (undefined1  [16])0x0;
              iVar19 = iVar5;
              do {
                auVar101 = *(undefined1 (*) [16])
                            (local_88._0_8_ + lVar23 + local_48 * local_88._16_8_ * lVar8);
                auVar91._0_14_ = auVar101._0_14_;
                auVar91[0xe] = auVar101[7];
                auVar91[0xf] = -(auVar101[7] < '\0');
                auVar90._14_2_ = auVar91._14_2_;
                auVar90._0_13_ = auVar101._0_13_;
                auVar90[0xd] = -(auVar101[6] < '\0');
                auVar89._13_3_ = auVar90._13_3_;
                auVar89._0_12_ = auVar101._0_12_;
                auVar89[0xc] = auVar101[6];
                auVar88._12_4_ = auVar89._12_4_;
                auVar88._0_11_ = auVar101._0_11_;
                auVar88[0xb] = -(auVar101[5] < '\0');
                auVar87._11_5_ = auVar88._11_5_;
                auVar87._0_10_ = auVar101._0_10_;
                auVar87[10] = auVar101[5];
                auVar86._10_6_ = auVar87._10_6_;
                auVar86._0_9_ = auVar101._0_9_;
                auVar86[9] = -(auVar101[4] < '\0');
                auVar85._9_7_ = auVar86._9_7_;
                auVar85._0_8_ = auVar101._0_8_;
                auVar85[8] = auVar101[4];
                auVar84._8_8_ = auVar85._8_8_;
                auVar84[7] = -(auVar101[3] < '\0');
                auVar84[6] = auVar101[3];
                auVar84[5] = -(auVar101[2] < '\0');
                auVar84[4] = auVar101[2];
                auVar84[3] = -(auVar101[1] < '\0');
                auVar84[2] = auVar101[1];
                auVar84[1] = -(auVar101[0] < '\0');
                auVar84[0] = auVar101[0];
                auVar71[1] = -(auVar101[8] < '\0');
                auVar71[0] = auVar101[8];
                auVar71[2] = auVar101[9];
                auVar71[3] = -(auVar101[9] < '\0');
                auVar71[4] = auVar101[10];
                auVar71[5] = -(auVar101[10] < '\0');
                auVar71[6] = auVar101[0xb];
                auVar71[7] = -(auVar101[0xb] < '\0');
                auVar71[8] = auVar101[0xc];
                auVar71[9] = -(auVar101[0xc] < '\0');
                auVar71[10] = auVar101[0xd];
                auVar71[0xb] = -(auVar101[0xd] < '\0');
                auVar71[0xc] = auVar101[0xe];
                auVar71[0xd] = -(auVar101[0xe] < '\0');
                auVar71[0xe] = auVar101[0xf];
                auVar71[0xf] = -(auVar101[0xf] < '\0');
                auVar101 = *(undefined1 (*) [16])((long)kernel->data + lVar23 * 2 + lVar18);
                auVar82 = *(undefined1 (*) [16])((long)kernel->data + lVar23 * 2 + lVar18 + 0x10);
                auVar109._0_14_ = auVar101._0_14_;
                auVar109[0xe] = auVar101[7];
                auVar109[0xf] = -(auVar101[7] < '\0');
                auVar108._14_2_ = auVar109._14_2_;
                auVar108._0_13_ = auVar101._0_13_;
                auVar108[0xd] = -(auVar101[6] < '\0');
                auVar107._13_3_ = auVar108._13_3_;
                auVar107._0_12_ = auVar101._0_12_;
                auVar107[0xc] = auVar101[6];
                auVar106._12_4_ = auVar107._12_4_;
                auVar106._0_11_ = auVar101._0_11_;
                auVar106[0xb] = -(auVar101[5] < '\0');
                auVar105._11_5_ = auVar106._11_5_;
                auVar105._0_10_ = auVar101._0_10_;
                auVar105[10] = auVar101[5];
                auVar104._10_6_ = auVar105._10_6_;
                auVar104._0_9_ = auVar101._0_9_;
                auVar104[9] = -(auVar101[4] < '\0');
                auVar103._9_7_ = auVar104._9_7_;
                auVar103._0_8_ = auVar101._0_8_;
                auVar103[8] = auVar101[4];
                auVar102._8_8_ = auVar103._8_8_;
                auVar102[7] = -(auVar101[3] < '\0');
                auVar102[6] = auVar101[3];
                auVar102[5] = -(auVar101[2] < '\0');
                auVar102[4] = auVar101[2];
                auVar102[3] = -(auVar101[1] < '\0');
                auVar102[2] = auVar101[1];
                auVar102[1] = -(auVar101[0] < '\0');
                auVar102[0] = auVar101[0];
                auVar83[1] = -(auVar101[8] < '\0');
                auVar83[0] = auVar101[8];
                auVar83[2] = auVar101[9];
                auVar83[3] = -(auVar101[9] < '\0');
                auVar83[4] = auVar101[10];
                auVar83[5] = -(auVar101[10] < '\0');
                auVar83[6] = auVar101[0xb];
                auVar83[7] = -(auVar101[0xb] < '\0');
                auVar83[8] = auVar101[0xc];
                auVar83[9] = -(auVar101[0xc] < '\0');
                auVar83[10] = auVar101[0xd];
                auVar83[0xb] = -(auVar101[0xd] < '\0');
                auVar83[0xc] = auVar101[0xe];
                auVar83[0xd] = -(auVar101[0xe] < '\0');
                auVar83[0xe] = auVar101[0xf];
                auVar83[0xf] = -(auVar101[0xf] < '\0');
                auVar99._0_14_ = auVar82._0_14_;
                auVar99[0xe] = auVar82[7];
                auVar99[0xf] = -(auVar82[7] < '\0');
                auVar98._14_2_ = auVar99._14_2_;
                auVar98._0_13_ = auVar82._0_13_;
                auVar98[0xd] = -(auVar82[6] < '\0');
                auVar97._13_3_ = auVar98._13_3_;
                auVar97._0_12_ = auVar82._0_12_;
                auVar97[0xc] = auVar82[6];
                auVar96._12_4_ = auVar97._12_4_;
                auVar96._0_11_ = auVar82._0_11_;
                auVar96[0xb] = -(auVar82[5] < '\0');
                auVar95._11_5_ = auVar96._11_5_;
                auVar95._0_10_ = auVar82._0_10_;
                auVar95[10] = auVar82[5];
                auVar94._10_6_ = auVar95._10_6_;
                auVar94._0_9_ = auVar82._0_9_;
                auVar94[9] = -(auVar82[4] < '\0');
                auVar93._9_7_ = auVar94._9_7_;
                auVar93._0_8_ = auVar82._0_8_;
                auVar93[8] = auVar82[4];
                auVar92._8_8_ = auVar93._8_8_;
                auVar92[7] = -(auVar82[3] < '\0');
                auVar92[6] = auVar82[3];
                auVar92[5] = -(auVar82[2] < '\0');
                auVar92[4] = auVar82[2];
                auVar92[3] = -(auVar82[1] < '\0');
                auVar92[2] = auVar82[1];
                auVar92[1] = -(auVar82[0] < '\0');
                auVar92[0] = auVar82[0];
                auVar72[1] = -(auVar82[8] < '\0');
                auVar72[0] = auVar82[8];
                auVar72[2] = auVar82[9];
                auVar72[3] = -(auVar82[9] < '\0');
                auVar72[4] = auVar82[10];
                auVar72[5] = -(auVar82[10] < '\0');
                auVar72[6] = auVar82[0xb];
                auVar72[7] = -(auVar82[0xb] < '\0');
                auVar72[8] = auVar82[0xc];
                auVar72[9] = -(auVar82[0xc] < '\0');
                auVar72[10] = auVar82[0xd];
                auVar72[0xb] = -(auVar82[0xd] < '\0');
                auVar72[0xc] = auVar82[0xe];
                auVar72[0xd] = -(auVar82[0xe] < '\0');
                auVar72[0xe] = auVar82[0xf];
                auVar72[0xf] = -(auVar82[0xf] < '\0');
                auVar101 = pmaddwd(auVar84,auVar102);
                iVar22 = iVar22 + auVar101._0_4_;
                iVar24 = iVar24 + auVar101._4_4_;
                iVar25 = iVar25 + auVar101._8_4_;
                iVar26 = iVar26 + auVar101._12_4_;
                auVar101 = pmaddwd(auVar84,auVar83);
                iVar59 = iVar59 + auVar101._0_4_;
                iVar68 = iVar68 + auVar101._4_4_;
                iVar69 = iVar69 + auVar101._8_4_;
                iVar70 = iVar70 + auVar101._12_4_;
                auVar101 = pmaddwd(auVar84,auVar92);
                auVar82._0_4_ = auVar100._0_4_ + auVar101._0_4_;
                auVar82._4_4_ = auVar100._4_4_ + auVar101._4_4_;
                auVar82._8_4_ = auVar100._8_4_ + auVar101._8_4_;
                auVar82._12_4_ = auVar100._12_4_ + auVar101._12_4_;
                auVar101 = pmaddwd(auVar84,auVar72);
                iVar54 = iVar54 + auVar101._0_4_;
                iVar56 = iVar56 + auVar101._4_4_;
                iVar57 = iVar57 + auVar101._8_4_;
                iVar58 = iVar58 + auVar101._12_4_;
                auVar101 = pmaddwd(auVar102,auVar71);
                iVar27 = iVar27 + auVar101._0_4_;
                iVar28 = iVar28 + auVar101._4_4_;
                iVar29 = iVar29 + auVar101._8_4_;
                iVar30 = iVar30 + auVar101._12_4_;
                auVar101 = pmaddwd(auVar83,auVar71);
                iVar49 = iVar49 + auVar101._0_4_;
                iVar51 = iVar51 + auVar101._4_4_;
                iVar52 = iVar52 + auVar101._8_4_;
                iVar53 = iVar53 + auVar101._12_4_;
                auVar100 = pmaddwd(auVar92,auVar71);
                auVar101._0_4_ = auVar73._0_4_ + auVar100._0_4_;
                auVar101._4_4_ = auVar73._4_4_ + auVar100._4_4_;
                auVar101._8_4_ = auVar73._8_4_ + auVar100._8_4_;
                auVar101._12_4_ = auVar73._12_4_ + auVar100._12_4_;
                auVar73 = pmaddwd(auVar72,auVar71);
                iVar31 = iVar31 + auVar73._0_4_;
                iVar44 = iVar44 + auVar73._4_4_;
                iVar47 = iVar47 + auVar73._8_4_;
                iVar48 = iVar48 + auVar73._12_4_;
                lVar23 = lVar23 + 0x10;
                iVar19 = iVar19 + -1;
                auVar73 = auVar101;
                auVar100 = auVar82;
              } while (iVar19 != 0);
            }
            auVar73._0_4_ = iVar30 + iVar29 + iVar28 + iVar27;
            auVar73._4_4_ = iVar53 + iVar52 + iVar51 + iVar49;
            auVar73._8_4_ = auVar101._12_4_ + auVar101._8_4_ + auVar101._4_4_ + auVar101._0_4_;
            auVar73._12_4_ = iVar48 + iVar47 + iVar44 + iVar31;
            *piVar6 = iVar26 + iVar25 + iVar24 + iVar22;
            piVar6[1] = iVar70 + iVar69 + iVar68 + iVar59;
            piVar6[2] = auVar82._12_4_ + auVar82._8_4_ + auVar82._4_4_ + auVar82._0_4_;
            piVar6[3] = iVar58 + iVar57 + iVar56 + iVar54;
            *(undefined1 (*) [16])(piVar6 + 4) = auVar73;
            piVar6 = piVar6 + 8;
            uVar17 = uVar12 + 2;
            lVar18 = uVar12 + 3;
            lVar8 = lVar8 + 1;
            uVar12 = uVar17;
          } while (lVar18 < (long)uVar7);
        }
        if ((int)uVar17 < (int)uVar1) {
          do {
            if (iVar5 < 1) {
              iVar22 = 0;
              iVar24 = 0;
              iVar25 = 0;
              iVar26 = 0;
              auVar100 = (undefined1  [16])0x0;
              iVar27 = 0;
              iVar28 = 0;
              iVar29 = 0;
              iVar30 = 0;
              iVar31 = 0;
              iVar44 = 0;
              iVar47 = 0;
              iVar48 = 0;
            }
            else {
              pauVar10 = (undefined1 (*) [16])
                         (kernel->cstep * uVar11 * kernel->elemsize + (long)kernel->data);
              iVar31 = 0;
              iVar44 = 0;
              iVar47 = 0;
              iVar48 = 0;
              lVar8 = 0;
              iVar27 = 0;
              iVar28 = 0;
              iVar29 = 0;
              iVar30 = 0;
              iVar22 = 0;
              iVar24 = 0;
              iVar25 = 0;
              iVar26 = 0;
              auVar101 = (undefined1  [16])0x0;
              do {
                uVar12 = *(ulong *)(local_88._0_8_ +
                                   lVar8 * 8 +
                                   local_48 * local_88._16_8_ *
                                   (ulong)(((uint)uVar17 & 1) + ((uint)(uVar17 >> 1) & 0x7fffffff)))
                ;
                auVar32[0] = (char)uVar12;
                cVar40 = (char)(uVar12 >> 8);
                cVar41 = (char)(uVar12 >> 0x10);
                cVar42 = (char)(uVar12 >> 0x18);
                cVar43 = (char)(uVar12 >> 0x20);
                cVar45 = (char)(uVar12 >> 0x28);
                cVar46 = (char)(uVar12 >> 0x30);
                auVar39._8_6_ = 0;
                auVar39._0_8_ = uVar12;
                auVar39[0xe] = (char)(uVar12 >> 0x38);
                auVar39[0xf] = -((long)uVar12 < 0);
                auVar38._14_2_ = auVar39._14_2_;
                auVar38._8_5_ = 0;
                auVar38._0_8_ = uVar12;
                auVar38[0xd] = -(cVar46 < '\0');
                auVar37._13_3_ = auVar38._13_3_;
                auVar37._8_4_ = 0;
                auVar37._0_8_ = uVar12;
                auVar37[0xc] = cVar46;
                auVar36._12_4_ = auVar37._12_4_;
                auVar36._8_3_ = 0;
                auVar36._0_8_ = uVar12;
                auVar36[0xb] = -(cVar45 < '\0');
                auVar35._11_5_ = auVar36._11_5_;
                auVar35._8_2_ = 0;
                auVar35._0_8_ = uVar12;
                auVar35[10] = cVar45;
                auVar34._10_6_ = auVar35._10_6_;
                auVar34[8] = 0;
                auVar34._0_8_ = uVar12;
                auVar34[9] = -(cVar43 < '\0');
                auVar33._9_7_ = auVar34._9_7_;
                auVar33[8] = cVar43;
                auVar33._0_8_ = uVar12;
                auVar32._8_8_ = auVar33._8_8_;
                auVar32[7] = -(cVar42 < '\0');
                auVar32[6] = cVar42;
                auVar32[5] = -(cVar41 < '\0');
                auVar32[4] = cVar41;
                auVar32[3] = -(cVar40 < '\0');
                auVar32[2] = cVar40;
                auVar32[1] = -(auVar32[0] < '\0');
                auVar82 = *pauVar10;
                auVar73 = pauVar10[1];
                auVar81._0_14_ = auVar82._0_14_;
                auVar81[0xe] = auVar82[7];
                auVar81[0xf] = -(auVar82[7] < '\0');
                auVar80._14_2_ = auVar81._14_2_;
                auVar80._0_13_ = auVar82._0_13_;
                auVar80[0xd] = -(auVar82[6] < '\0');
                auVar79._13_3_ = auVar80._13_3_;
                auVar79._0_12_ = auVar82._0_12_;
                auVar79[0xc] = auVar82[6];
                auVar78._12_4_ = auVar79._12_4_;
                auVar78._0_11_ = auVar82._0_11_;
                auVar78[0xb] = -(auVar82[5] < '\0');
                auVar77._11_5_ = auVar78._11_5_;
                auVar77._0_10_ = auVar82._0_10_;
                auVar77[10] = auVar82[5];
                auVar76._10_6_ = auVar77._10_6_;
                auVar76._0_9_ = auVar82._0_9_;
                auVar76[9] = -(auVar82[4] < '\0');
                auVar75._9_7_ = auVar76._9_7_;
                auVar75._0_8_ = auVar82._0_8_;
                auVar75[8] = auVar82[4];
                auVar74._8_8_ = auVar75._8_8_;
                auVar74[7] = -(auVar82[3] < '\0');
                auVar74[6] = auVar82[3];
                auVar74[5] = -(auVar82[2] < '\0');
                auVar74[4] = auVar82[2];
                auVar74[3] = -(auVar82[1] < '\0');
                auVar74[2] = auVar82[1];
                auVar74[1] = -(auVar82[0] < '\0');
                auVar74[0] = auVar82[0];
                auVar50[1] = -(auVar82[8] < '\0');
                auVar50[0] = auVar82[8];
                auVar50[2] = auVar82[9];
                auVar50[3] = -(auVar82[9] < '\0');
                auVar50[4] = auVar82[10];
                auVar50[5] = -(auVar82[10] < '\0');
                auVar50[6] = auVar82[0xb];
                auVar50[7] = -(auVar82[0xb] < '\0');
                auVar50[8] = auVar82[0xc];
                auVar50[9] = -(auVar82[0xc] < '\0');
                auVar50[10] = auVar82[0xd];
                auVar50[0xb] = -(auVar82[0xd] < '\0');
                auVar50[0xc] = auVar82[0xe];
                auVar50[0xd] = -(auVar82[0xe] < '\0');
                auVar50[0xe] = auVar82[0xf];
                auVar50[0xf] = -(auVar82[0xf] < '\0');
                auVar67._0_14_ = auVar73._0_14_;
                auVar67[0xe] = auVar73[7];
                auVar67[0xf] = -(auVar73[7] < '\0');
                auVar66._14_2_ = auVar67._14_2_;
                auVar66._0_13_ = auVar73._0_13_;
                auVar66[0xd] = -(auVar73[6] < '\0');
                auVar65._13_3_ = auVar66._13_3_;
                auVar65._0_12_ = auVar73._0_12_;
                auVar65[0xc] = auVar73[6];
                auVar64._12_4_ = auVar65._12_4_;
                auVar64._0_11_ = auVar73._0_11_;
                auVar64[0xb] = -(auVar73[5] < '\0');
                auVar63._11_5_ = auVar64._11_5_;
                auVar63._0_10_ = auVar73._0_10_;
                auVar63[10] = auVar73[5];
                auVar62._10_6_ = auVar63._10_6_;
                auVar62._0_9_ = auVar73._0_9_;
                auVar62[9] = -(auVar73[4] < '\0');
                auVar61._9_7_ = auVar62._9_7_;
                auVar61._0_8_ = auVar73._0_8_;
                auVar61[8] = auVar73[4];
                auVar60._8_8_ = auVar61._8_8_;
                auVar60[7] = -(auVar73[3] < '\0');
                auVar60[6] = auVar73[3];
                auVar60[5] = -(auVar73[2] < '\0');
                auVar60[4] = auVar73[2];
                auVar60[3] = -(auVar73[1] < '\0');
                auVar60[2] = auVar73[1];
                auVar60[1] = -(auVar73[0] < '\0');
                auVar60[0] = auVar73[0];
                auVar55[1] = -(auVar73[8] < '\0');
                auVar55[0] = auVar73[8];
                auVar55[2] = auVar73[9];
                auVar55[3] = -(auVar73[9] < '\0');
                auVar55[4] = auVar73[10];
                auVar55[5] = -(auVar73[10] < '\0');
                auVar55[6] = auVar73[0xb];
                auVar55[7] = -(auVar73[0xb] < '\0');
                auVar55[8] = auVar73[0xc];
                auVar55[9] = -(auVar73[0xc] < '\0');
                auVar55[10] = auVar73[0xd];
                auVar55[0xb] = -(auVar73[0xd] < '\0');
                auVar55[0xc] = auVar73[0xe];
                auVar55[0xd] = -(auVar73[0xe] < '\0');
                auVar55[0xe] = auVar73[0xf];
                auVar55[0xf] = -(auVar73[0xf] < '\0');
                auVar82 = pmaddwd(auVar74,auVar32);
                iVar22 = iVar22 + auVar82._0_4_;
                iVar24 = iVar24 + auVar82._4_4_;
                iVar25 = iVar25 + auVar82._8_4_;
                iVar26 = iVar26 + auVar82._12_4_;
                auVar82 = pmaddwd(auVar50,auVar32);
                auVar100._0_4_ = auVar101._0_4_ + auVar82._0_4_;
                auVar100._4_4_ = auVar101._4_4_ + auVar82._4_4_;
                auVar100._8_4_ = auVar101._8_4_ + auVar82._8_4_;
                auVar100._12_4_ = auVar101._12_4_ + auVar82._12_4_;
                auVar101 = pmaddwd(auVar60,auVar32);
                iVar27 = iVar27 + auVar101._0_4_;
                iVar28 = iVar28 + auVar101._4_4_;
                iVar29 = iVar29 + auVar101._8_4_;
                iVar30 = iVar30 + auVar101._12_4_;
                auVar101 = pmaddwd(auVar55,auVar32);
                iVar31 = iVar31 + auVar101._0_4_;
                iVar44 = iVar44 + auVar101._4_4_;
                iVar47 = iVar47 + auVar101._8_4_;
                iVar48 = iVar48 + auVar101._12_4_;
                pauVar10 = pauVar10 + 2;
                lVar8 = lVar8 + 1;
                auVar101 = auVar100;
              } while (iVar5 != (int)lVar8);
            }
            *piVar6 = iVar26 + iVar25 + iVar24 + iVar22;
            piVar6[1] = auVar100._12_4_ + auVar100._8_4_ + auVar100._4_4_ + auVar100._0_4_;
            piVar6[2] = iVar30 + iVar29 + iVar28 + iVar27;
            piVar6[3] = iVar48 + iVar47 + iVar44 + iVar31;
            piVar6 = piVar6 + 4;
            uVar14 = (uint)uVar17 + 1;
            uVar17 = (ulong)uVar14;
          } while (uVar14 != uVar1);
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != local_38);
    }
    piVar6 = (int *)CONCAT44(local_88._12_4_,local_88._8_4_);
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        if ((Allocator *)local_88._32_8_ == (Allocator *)0x0) {
          if ((void *)local_88._0_8_ != (void *)0x0) {
            free((void *)local_88._0_8_);
          }
        }
        else {
          (*(*(_func_int ***)local_88._32_8_)[3])();
        }
      }
    }
    return;
  }
  im2col_sgemm_pack8to4_int8_sse_xop(bottom_im2col,top_blob,kernel,opt);
  return;
}

Assistant:

static void im2col_sgemm_pack8to4_int8_sse(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Option& opt)
{
#if !(__AVX512VNNI__ || __AVXVNNI__ || __AVX2__ || __XOP__)
#if NCNN_RUNTIME_CPU && NCNN_AVX512VNNI && __AVX512F__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx512_vnni())
    {
        im2col_sgemm_pack8to4_int8_sse_avx512vnni(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVXVNNI && __AVX2__ && !__AVXVNNI__
    if (ncnn::cpu_support_x86_avx_vnni())
    {
        im2col_sgemm_pack8to4_int8_sse_avxvnni(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVX2 && __AVX__ && !__AVX2__
    if (ncnn::cpu_support_x86_avx2())
    {
        im2col_sgemm_pack8to4_int8_sse_avx2(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_XOP && __SSE2__ && !__XOP__
    if (ncnn::cpu_support_x86_xop())
    {
        im2col_sgemm_pack8to4_int8_sse_xop(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif
#endif

    // Mat bottom_im2col(size, maxk, inch, 8u, 8, opt.workspace_allocator);

    const int size = bottom_im2col.w;
    const int maxk = bottom_im2col.h;
    const int inch = bottom_im2col.c;

    const int outch = top_blob.c;

    // permute
    Mat tmp;
#if __AVX2__
    if (size >= 4)
        tmp.create(4 * maxk, inch, size / 4 + (size % 4) / 2 + size % 2, 8u, 8, opt.workspace_allocator);
    else if (size >= 2)
        tmp.create(2 * maxk, inch, size / 2 + size % 2, 8u, 8, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 8u, 8, opt.workspace_allocator);
#else
    if (size >= 2)
        tmp.create(2 * maxk, inch, size / 2 + size % 2, 8u, 8, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 8u, 8, opt.workspace_allocator);
#endif
    {
#if __AVX2__
        int remain_size_start = 0;
        int nn_size = size >> 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 4;

            int64_t* tmpptr = tmp.channel(i / 4);

            for (int q = 0; q < inch; q++)
            {
                const int64_t* img0 = (const int64_t*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    __m256i _v = _mm256_loadu_si256((const __m256i*)img0);
                    _mm256_storeu_si256((__m256i*)tmpptr, _v);
                    tmpptr += 4;
                    img0 += size;
                }
            }
        }

        remain_size_start += nn_size << 2;
        nn_size = (size - remain_size_start) >> 1;
#else
        int remain_size_start = 0;
        int nn_size = size >> 1;
#endif

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 2;

#if __AVX2__
            int64_t* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
#else
            int64_t* tmpptr = tmp.channel(i / 2);
#endif

            for (int q = 0; q < inch; q++)
            {
                const int64_t* img0 = (const int64_t*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    __m128i _v = _mm_loadu_si128((const __m128i*)img0);
                    _mm_storeu_si128((__m128i*)tmpptr, _v);
                    tmpptr += 2;
                    img0 += size;
                }
            }
        }

        remain_size_start += nn_size << 1;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
#if __AVX2__
            int64_t* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
#else
            int64_t* tmpptr = tmp.channel(i / 2 + i % 2);
#endif

            for (int q = 0; q < inch; q++)
            {
                const int64_t* img0 = (const int64_t*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr += 1;
                    img0 += size;
                }
            }
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        int* outptr0 = top_blob.channel(p);

        int i = 0;
#if __AVX2__
        for (; i + 3 < size; i += 4)
        {
            const signed char* tmpptr = tmp.channel(i / 4);
            const signed char* kptr0 = kernel.channel(p);

            int nn = inch * maxk; // inch always > 0

            __m256i _sum00_11 = _mm256_setzero_si256();
            __m256i _sum10_01 = _mm256_setzero_si256();
            __m256i _sum02_13 = _mm256_setzero_si256();
            __m256i _sum12_03 = _mm256_setzero_si256();

            __m256i _sum04_15 = _mm256_setzero_si256();
            __m256i _sum14_05 = _mm256_setzero_si256();
            __m256i _sum06_17 = _mm256_setzero_si256();
            __m256i _sum16_07 = _mm256_setzero_si256();

            int j = 0;
            for (; j < nn; j++)
            {
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m256i _val01_16 = _mm256_cvtepi8_epi16(_val01);

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);
                __m256i _w23_16 = _mm256_cvtepi8_epi16(_w23);

                __m256i _val10_16 = _mm256_permute4x64_epi64(_val01_16, 78);

#if __AVXVNNI__ || __AVX512VNNI__
                _sum00_11 = _mm256_dpwssd_epi32(_sum00_11, _val01_16, _w01_16);
                _sum10_01 = _mm256_dpwssd_epi32(_sum10_01, _val10_16, _w01_16);
                _sum02_13 = _mm256_dpwssd_epi32(_sum02_13, _val01_16, _w23_16);
                _sum12_03 = _mm256_dpwssd_epi32(_sum12_03, _val10_16, _w23_16);
#else
                _sum00_11 = _mm256_add_epi32(_sum00_11, _mm256_madd_epi16(_val01_16, _w01_16));
                _sum10_01 = _mm256_add_epi32(_sum10_01, _mm256_madd_epi16(_val10_16, _w01_16));
                _sum02_13 = _mm256_add_epi32(_sum02_13, _mm256_madd_epi16(_val01_16, _w23_16));
                _sum12_03 = _mm256_add_epi32(_sum12_03, _mm256_madd_epi16(_val10_16, _w23_16));
#endif

                __m128i _val23 = _mm_loadu_si128((const __m128i*)(tmpptr + 16));
                __m256i _val23_16 = _mm256_cvtepi8_epi16(_val23);
                __m256i _val32_16 = _mm256_permute4x64_epi64(_val23_16, 78);

#if __AVXVNNI__ || __AVX512VNNI__
                _sum04_15 = _mm256_dpwssd_epi32(_sum04_15, _val23_16, _w01_16);
                _sum14_05 = _mm256_dpwssd_epi32(_sum14_05, _val32_16, _w01_16);
                _sum06_17 = _mm256_dpwssd_epi32(_sum06_17, _val23_16, _w23_16);
                _sum16_07 = _mm256_dpwssd_epi32(_sum16_07, _val32_16, _w23_16);
#else
                _sum04_15 = _mm256_add_epi32(_sum04_15, _mm256_madd_epi16(_val23_16, _w01_16));
                _sum14_05 = _mm256_add_epi32(_sum14_05, _mm256_madd_epi16(_val32_16, _w01_16));
                _sum06_17 = _mm256_add_epi32(_sum06_17, _mm256_madd_epi16(_val23_16, _w23_16));
                _sum16_07 = _mm256_add_epi32(_sum16_07, _mm256_madd_epi16(_val32_16, _w23_16));
#endif

                tmpptr += 32;
                kptr0 += 32;
            }

            // transpose 4x8
            {
                __m256i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm256_unpacklo_epi32(_sum00_11, _sum10_01);
                _tmp1 = _mm256_unpacklo_epi32(_sum02_13, _sum12_03);
                _tmp2 = _mm256_unpackhi_epi32(_sum00_11, _sum10_01);
                _tmp3 = _mm256_unpackhi_epi32(_sum02_13, _sum12_03);
                _sum00_11 = _mm256_unpacklo_epi64(_tmp0, _tmp1);
                _sum10_01 = _mm256_unpackhi_epi64(_tmp0, _tmp1);
                _sum02_13 = _mm256_unpacklo_epi64(_tmp2, _tmp3);
                _sum12_03 = _mm256_unpackhi_epi64(_tmp2, _tmp3);
            }
            {
                __m256i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm256_unpacklo_epi32(_sum04_15, _sum14_05);
                _tmp1 = _mm256_unpacklo_epi32(_sum06_17, _sum16_07);
                _tmp2 = _mm256_unpackhi_epi32(_sum04_15, _sum14_05);
                _tmp3 = _mm256_unpackhi_epi32(_sum06_17, _sum16_07);
                _sum04_15 = _mm256_unpacklo_epi64(_tmp0, _tmp1);
                _sum14_05 = _mm256_unpackhi_epi64(_tmp0, _tmp1);
                _sum06_17 = _mm256_unpacklo_epi64(_tmp2, _tmp3);
                _sum16_07 = _mm256_unpackhi_epi64(_tmp2, _tmp3);
            }

            _sum00_11 = _mm256_add_epi32(_sum00_11, _sum10_01);
            _sum02_13 = _mm256_add_epi32(_sum02_13, _sum12_03);
            _sum00_11 = _mm256_add_epi32(_sum00_11, _sum02_13);

            _sum04_15 = _mm256_add_epi32(_sum04_15, _sum14_05);
            _sum06_17 = _mm256_add_epi32(_sum06_17, _sum16_07);
            _sum04_15 = _mm256_add_epi32(_sum04_15, _sum06_17);

            __m256i _perm_mask = _mm256_set_epi32(6, 3, 4, 1, 7, 2, 5, 0);
            _sum00_11 = _mm256_permutevar8x32_epi32(_sum00_11, _perm_mask);
            _sum04_15 = _mm256_permutevar8x32_epi32(_sum04_15, _perm_mask);

            _mm256_storeu_si256((__m256i*)outptr0, _sum00_11);
            _mm256_storeu_si256((__m256i*)(outptr0 + 8), _sum04_15);
            outptr0 += 16;
        }
#endif
        for (; i + 1 < size; i += 2)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2);
#endif
            const signed char* kptr0 = kernel.channel(p);

            int nn = inch * maxk; // inch always > 0

#if __AVX2__
            __m256i _sum00_11 = _mm256_setzero_si256();
            __m256i _sum10_01 = _mm256_setzero_si256();
            __m256i _sum02_13 = _mm256_setzero_si256();
            __m256i _sum12_03 = _mm256_setzero_si256();
#else
            __m128i _sum00 = _mm_setzero_si128();
            __m128i _sum01 = _mm_setzero_si128();
            __m128i _sum02 = _mm_setzero_si128();
            __m128i _sum03 = _mm_setzero_si128();
            __m128i _sum10 = _mm_setzero_si128();
            __m128i _sum11 = _mm_setzero_si128();
            __m128i _sum12 = _mm_setzero_si128();
            __m128i _sum13 = _mm_setzero_si128();
#endif

            int j = 0;
            for (; j < nn; j++)
            {
#if __AVX2__
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m256i _val01_16 = _mm256_cvtepi8_epi16(_val01);

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);
                __m256i _w23_16 = _mm256_cvtepi8_epi16(_w23);

                __m256i _val10_16 = _mm256_permute4x64_epi64(_val01_16, 78);

#if __AVXVNNI__ || __AVX512VNNI__
                _sum00_11 = _mm256_dpwssd_epi32(_sum00_11, _val01_16, _w01_16);
                _sum10_01 = _mm256_dpwssd_epi32(_sum10_01, _val10_16, _w01_16);
                _sum02_13 = _mm256_dpwssd_epi32(_sum02_13, _val01_16, _w23_16);
                _sum12_03 = _mm256_dpwssd_epi32(_sum12_03, _val10_16, _w23_16);
#else
                _sum00_11 = _mm256_add_epi32(_sum00_11, _mm256_madd_epi16(_val01_16, _w01_16));
                _sum10_01 = _mm256_add_epi32(_sum10_01, _mm256_madd_epi16(_val10_16, _w01_16));
                _sum02_13 = _mm256_add_epi32(_sum02_13, _mm256_madd_epi16(_val01_16, _w23_16));
                _sum12_03 = _mm256_add_epi32(_sum12_03, _mm256_madd_epi16(_val10_16, _w23_16));
#endif
#else
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m128i _extval01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _val01);
                __m128i _val0 = _mm_unpacklo_epi8(_val01, _extval01);
                __m128i _val1 = _mm_unpackhi_epi8(_val01, _extval01);

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                __m128i _extw23 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w23);
                __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
                __m128i _w1 = _mm_unpackhi_epi8(_w01, _extw01);
                __m128i _w2 = _mm_unpacklo_epi8(_w23, _extw23);
                __m128i _w3 = _mm_unpackhi_epi8(_w23, _extw23);

#if __XOP__
                _sum00 = _mm_maddd_epi16(_val0, _w0, _sum00);
                _sum01 = _mm_maddd_epi16(_val0, _w1, _sum01);
                _sum02 = _mm_maddd_epi16(_val0, _w2, _sum02);
                _sum03 = _mm_maddd_epi16(_val0, _w3, _sum03);
                _sum10 = _mm_maddd_epi16(_val1, _w0, _sum10);
                _sum11 = _mm_maddd_epi16(_val1, _w1, _sum11);
                _sum12 = _mm_maddd_epi16(_val1, _w2, _sum12);
                _sum13 = _mm_maddd_epi16(_val1, _w3, _sum13);
#else
                _sum00 = _mm_add_epi32(_mm_madd_epi16(_val0, _w0), _sum00);
                _sum01 = _mm_add_epi32(_mm_madd_epi16(_val0, _w1), _sum01);
                _sum02 = _mm_add_epi32(_mm_madd_epi16(_val0, _w2), _sum02);
                _sum03 = _mm_add_epi32(_mm_madd_epi16(_val0, _w3), _sum03);
                _sum10 = _mm_add_epi32(_mm_madd_epi16(_val1, _w0), _sum10);
                _sum11 = _mm_add_epi32(_mm_madd_epi16(_val1, _w1), _sum11);
                _sum12 = _mm_add_epi32(_mm_madd_epi16(_val1, _w2), _sum12);
                _sum13 = _mm_add_epi32(_mm_madd_epi16(_val1, _w3), _sum13);
#endif
#endif

                tmpptr += 16;
                kptr0 += 32;
            }

#if __AVX2__
            // transpose 4x8
            {
                __m256i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm256_unpacklo_epi32(_sum00_11, _sum10_01);
                _tmp1 = _mm256_unpacklo_epi32(_sum02_13, _sum12_03);
                _tmp2 = _mm256_unpackhi_epi32(_sum00_11, _sum10_01);
                _tmp3 = _mm256_unpackhi_epi32(_sum02_13, _sum12_03);
                _sum00_11 = _mm256_unpacklo_epi64(_tmp0, _tmp1);
                _sum10_01 = _mm256_unpackhi_epi64(_tmp0, _tmp1);
                _sum02_13 = _mm256_unpacklo_epi64(_tmp2, _tmp3);
                _sum12_03 = _mm256_unpackhi_epi64(_tmp2, _tmp3);
            }

            _sum00_11 = _mm256_add_epi32(_sum00_11, _sum10_01);
            _sum02_13 = _mm256_add_epi32(_sum02_13, _sum12_03);
            _sum00_11 = _mm256_add_epi32(_sum00_11, _sum02_13);

            __m256i _perm_mask = _mm256_set_epi32(6, 3, 4, 1, 7, 2, 5, 0);
            _sum00_11 = _mm256_permutevar8x32_epi32(_sum00_11, _perm_mask);

            _mm256_storeu_si256((__m256i*)outptr0, _sum00_11);
#else
            // transpose 4x4
            {
                __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm_unpacklo_epi32(_sum00, _sum01);
                _tmp1 = _mm_unpacklo_epi32(_sum02, _sum03);
                _tmp2 = _mm_unpackhi_epi32(_sum00, _sum01);
                _tmp3 = _mm_unpackhi_epi32(_sum02, _sum03);
                _sum00 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                _sum01 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                _sum02 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                _sum03 = _mm_unpackhi_epi64(_tmp2, _tmp3);
            }
            {
                __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm_unpacklo_epi32(_sum10, _sum11);
                _tmp1 = _mm_unpacklo_epi32(_sum12, _sum13);
                _tmp2 = _mm_unpackhi_epi32(_sum10, _sum11);
                _tmp3 = _mm_unpackhi_epi32(_sum12, _sum13);
                _sum10 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                _sum11 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                _sum12 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                _sum13 = _mm_unpackhi_epi64(_tmp2, _tmp3);
            }

            _sum00 = _mm_add_epi32(_sum00, _sum01);
            _sum02 = _mm_add_epi32(_sum02, _sum03);
            _sum10 = _mm_add_epi32(_sum10, _sum11);
            _sum12 = _mm_add_epi32(_sum12, _sum13);

            _sum00 = _mm_add_epi32(_sum00, _sum02);
            _sum10 = _mm_add_epi32(_sum10, _sum12);

            _mm_storeu_si128((__m128i*)outptr0, _sum00);
            _mm_storeu_si128((__m128i*)(outptr0 + 4), _sum10);
#endif
            outptr0 += 8;
        }
        for (; i < size; i++)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2 + i % 2);
#endif
            const signed char* kptr0 = kernel.channel(p);

            int nn = inch * maxk; // inch always > 0

#if __AVX2__
            __m256i _sum0_1 = _mm256_setzero_si256();
            __m256i _sum2_3 = _mm256_setzero_si256();
#else
            __m128i _sum0 = _mm_setzero_si128();
            __m128i _sum1 = _mm_setzero_si128();
            __m128i _sum2 = _mm_setzero_si128();
            __m128i _sum3 = _mm_setzero_si128();
#endif

            int j = 0;
            for (; j < nn; j++)
            {
#if __AVX2__
                __m128i _val = _mm_loadl_epi64((const __m128i*)tmpptr);
                _val = _mm_cvtepi8_epi16(_val);

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);
                __m256i _w23_16 = _mm256_cvtepi8_epi16(_w23);

                __m256i _valval = _mm256_inserti128_si256(_mm256_castsi128_si256(_val), _val, 1);

#if __AVXVNNI__ || __AVX512VNNI__
                _sum0_1 = _mm256_dpwssd_epi32(_sum0_1, _valval, _w01_16);
                _sum2_3 = _mm256_dpwssd_epi32(_sum2_3, _valval, _w23_16);
#else
                _sum0_1 = _mm256_add_epi32(_sum0_1, _mm256_madd_epi16(_valval, _w01_16));
                _sum2_3 = _mm256_add_epi32(_sum2_3, _mm256_madd_epi16(_valval, _w23_16));
#endif
#else
                __m128i _val = _mm_loadl_epi64((const __m128i*)tmpptr);
#if __SSE4_1__
                _val = _mm_cvtepi8_epi16(_val);
#else
                _val = _mm_unpacklo_epi8(_val, _mm_cmpgt_epi8(_mm_setzero_si128(), _val));
#endif

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                __m128i _extw23 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w23);
                __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
                __m128i _w1 = _mm_unpackhi_epi8(_w01, _extw01);
                __m128i _w2 = _mm_unpacklo_epi8(_w23, _extw23);
                __m128i _w3 = _mm_unpackhi_epi8(_w23, _extw23);

#if __XOP__
                _sum0 = _mm_maddd_epi16(_val, _w0, _sum0);
                _sum1 = _mm_maddd_epi16(_val, _w1, _sum1);
                _sum2 = _mm_maddd_epi16(_val, _w2, _sum2);
                _sum3 = _mm_maddd_epi16(_val, _w3, _sum3);
#else
                _sum0 = _mm_add_epi32(_mm_madd_epi16(_val, _w0), _sum0);
                _sum1 = _mm_add_epi32(_mm_madd_epi16(_val, _w1), _sum1);
                _sum2 = _mm_add_epi32(_mm_madd_epi16(_val, _w2), _sum2);
                _sum3 = _mm_add_epi32(_mm_madd_epi16(_val, _w3), _sum3);
#endif
#endif

                tmpptr += 8;
                kptr0 += 32;
            }

#if __AVX2__
            __m128i _sum0 = _mm256_extracti128_si256(_sum0_1, 0);
            __m128i _sum1 = _mm256_extracti128_si256(_sum0_1, 1);
            __m128i _sum2 = _mm256_extracti128_si256(_sum2_3, 0);
            __m128i _sum3 = _mm256_extracti128_si256(_sum2_3, 1);
#endif

            // transpose 4x4
            {
                __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm_unpacklo_epi32(_sum0, _sum1);
                _tmp1 = _mm_unpacklo_epi32(_sum2, _sum3);
                _tmp2 = _mm_unpackhi_epi32(_sum0, _sum1);
                _tmp3 = _mm_unpackhi_epi32(_sum2, _sum3);
                _sum0 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                _sum1 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                _sum2 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                _sum3 = _mm_unpackhi_epi64(_tmp2, _tmp3);
            }

            _sum0 = _mm_add_epi32(_sum0, _sum1);
            _sum2 = _mm_add_epi32(_sum2, _sum3);

            _sum0 = _mm_add_epi32(_sum0, _sum2);

            _mm_storeu_si128((__m128i*)outptr0, _sum0);
            outptr0 += 4;
        }
    }
}